

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Cluster.cpp
# Opt level: O2

Cluster * __thiscall amrex::Cluster::new_chop(Cluster *this)

{
  Long LVar1;
  int n;
  int iVar2;
  int *piVar3;
  ulong uVar4;
  IntVect *a;
  __uniq_ptr_data<amrex::Cluster,_std::default_delete<amrex::Cluster>,_true,_true> this_00;
  int minlen;
  int iVar5;
  CutStatus CVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  Vector<int,_std::allocator<int>_> *pVVar12;
  ulong uVar13;
  bool bVar14;
  Real RVar15;
  Real RVar16;
  Real RVar17;
  IntVect IVar18;
  Cut __pred;
  uint local_d4;
  IntVect cut;
  _Head_base<0UL,_amrex::Cluster_*,_false> local_c0;
  unique_ptr<amrex::Cluster,_std::default_delete<amrex::Cluster>_> newbox;
  CutStatus status [3];
  int local_a0;
  Array<Vector<int>,_3> hist;
  
  IVar18 = Box::size(&this->m_bx);
  hist._M_elems[2].super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  hist._M_elems[2].super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  hist._M_elems[1].super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  hist._M_elems[1].super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)0x0;
  hist._M_elems[0].super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)0x0;
  hist._M_elems[1].super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  hist._M_elems[0].super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  hist._M_elems[0].super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  hist._M_elems[2].super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)0x0;
  status[0] = HoleCut;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)&hist,(long)IVar18.vect[0],
             (value_type_conflict *)status);
  status[0] = HoleCut;
  std::vector<int,_std::allocator<int>_>::resize
            (&hist._M_elems[1].super_vector<int,_std::allocator<int>_>,IVar18.vect._0_8_ >> 0x20,
             (value_type_conflict *)status);
  status[0] = HoleCut;
  std::vector<int,_std::allocator<int>_>::resize
            (&hist._M_elems[2].super_vector<int,_std::allocator<int>_>,(long)IVar18.vect[2],
             (value_type_conflict *)status);
  lVar8 = 0;
  if (0 < this->m_len) {
    lVar8 = this->m_len;
  }
  piVar3 = this->m_ar->vect + 2;
  while (bVar14 = lVar8 != 0, lVar8 = lVar8 + -1, bVar14) {
    hist._M_elems[0].super_vector<int,_std::allocator<int>_>.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [(long)((IntVect *)(piVar3 + -2))->vect[0] - (long)(this->m_bx).smallend.vect[0]] =
         hist._M_elems[0].super_vector<int,_std::allocator<int>_>.
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         [(long)((IntVect *)(piVar3 + -2))->vect[0] - (long)(this->m_bx).smallend.vect[0]] + 1;
    hist._M_elems[1].super_vector<int,_std::allocator<int>_>.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [(long)piVar3[-1] - (long)(this->m_bx).smallend.vect[1]] =
         hist._M_elems[1].super_vector<int,_std::allocator<int>_>.
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         [(long)piVar3[-1] - (long)(this->m_bx).smallend.vect[1]] + 1;
    hist._M_elems[2].super_vector<int,_std::allocator<int>_>.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [(long)*piVar3 - (long)(this->m_bx).smallend.vect[2]] =
         hist._M_elems[2].super_vector<int,_std::allocator<int>_>.
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         [(long)*piVar3 - (long)(this->m_bx).smallend.vect[2]] + 1;
    piVar3 = piVar3 + 3;
  }
  iVar10 = 0;
  local_d4 = 0xffffffff;
  while( true ) {
    if (iVar10 == 2) {
      Abort_host("Should never reach this point in Cluster::new_chop()");
      local_c0._M_head_impl = this;
      goto LAB_005df979;
    }
    cut.vect[0] = 0;
    cut.vect[1] = 0;
    cut.vect[2] = 0;
    pVVar12 = hist._M_elems;
    CVar6 = InvalidCut;
    for (lVar8 = 0; lVar8 != 0xc; lVar8 = lVar8 + 4) {
      if ((ulong)local_d4 << 2 != lVar8) {
        iVar2 = FindCut((((_Vector_base<int,_std::allocator<int>_> *)
                         &(pVVar12->super_vector<int,_std::allocator<int>_>).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl)->_M_impl).
                        super__Vector_impl_data._M_start,
                        *(int *)((long)(this->m_bx).smallend.vect + lVar8),
                        *(int *)((long)(this->m_bx).bigend.vect + lVar8),
                        (CutStatus *)((long)status + lVar8));
        *(int *)((long)cut.vect + lVar8) = iVar2;
        if ((int)*(CutStatus *)((long)status + lVar8) < (int)CVar6) {
          CVar6 = *(CutStatus *)((long)status + lVar8);
        }
      }
      pVVar12 = pVVar12 + 1;
    }
    iVar2 = -1;
    uVar13 = 0xffffffff;
    for (uVar4 = 0; uVar4 != 3; uVar4 = uVar4 + 1) {
      if (status[uVar4] == CVar6) {
        iVar7 = (this->m_bx).bigend.vect[uVar4] - cut.vect[uVar4];
        iVar5 = cut.vect[uVar4] - (this->m_bx).smallend.vect[uVar4];
        if (iVar5 <= iVar7) {
          iVar7 = iVar5;
        }
        if (iVar2 <= iVar7) {
          uVar13 = uVar4 & 0xffffffff;
        }
        if (iVar2 < iVar7) {
          iVar2 = iVar7;
        }
      }
    }
    uVar11 = (uint)uVar13;
    uVar9 = 0;
    for (lVar8 = 0; (this->m_bx).smallend.vect[(int)uVar11] + lVar8 < (long)cut.vect[(int)uVar11];
        lVar8 = lVar8 + 1) {
      uVar9 = uVar9 + *(int *)((long)hist._M_elems[(int)uVar11].
                                     super_vector<int,_std::allocator<int>_>.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start + lVar8 * 4);
    }
    if ((int)uVar9 < 1) break;
    lVar8 = this->m_len;
    if (lVar8 <= (long)(ulong)uVar9) break;
    __pred._8_8_ = uVar13 << 0x20 | (ulong)(uint)cut.vect[2];
    __pred.m_cut.vect[0] = cut.vect[0];
    __pred.m_cut.vect[1] = cut.vect[1];
    a = std::partition<amrex::IntVect*,amrex::(anonymous_namespace)::Cut>
                  (this->m_ar,this->m_ar + lVar8,__pred);
    RVar15 = eff(this);
    LVar1 = this->m_len;
    this_00.super___uniq_ptr_impl<amrex::Cluster,_std::default_delete<amrex::Cluster>_>._M_t.
    super__Tuple_impl<0UL,_amrex::Cluster_*,_std::default_delete<amrex::Cluster>_>.
    super__Head_base<0UL,_amrex::Cluster_*,_false>._M_head_impl =
         (__uniq_ptr_impl<amrex::Cluster,_std::default_delete<amrex::Cluster>_>)operator_new(0x30);
    Cluster((Cluster *)
            this_00.super___uniq_ptr_impl<amrex::Cluster,_std::default_delete<amrex::Cluster>_>._M_t
            .super__Tuple_impl<0UL,_amrex::Cluster_*,_std::default_delete<amrex::Cluster>_>.
            super__Head_base<0UL,_amrex::Cluster_*,_false>._M_head_impl,a,
            (long)(int)((int)lVar8 - uVar9));
    newbox._M_t.super___uniq_ptr_impl<amrex::Cluster,_std::default_delete<amrex::Cluster>_>._M_t.
    super__Tuple_impl<0UL,_amrex::Cluster_*,_std::default_delete<amrex::Cluster>_>.
    super__Head_base<0UL,_amrex::Cluster_*,_false>._M_head_impl =
         (__uniq_ptr_data<amrex::Cluster,_std::default_delete<amrex::Cluster>,_true,_true>)
         (__uniq_ptr_data<amrex::Cluster,_std::default_delete<amrex::Cluster>,_true,_true>)
         this_00.super___uniq_ptr_impl<amrex::Cluster,_std::default_delete<amrex::Cluster>_>._M_t.
         super__Tuple_impl<0UL,_amrex::Cluster_*,_std::default_delete<amrex::Cluster>_>.
         super__Head_base<0UL,_amrex::Cluster_*,_false>._M_head_impl;
    RVar16 = eff((Cluster *)
                 this_00.super___uniq_ptr_impl<amrex::Cluster,_std::default_delete<amrex::Cluster>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_amrex::Cluster_*,_std::default_delete<amrex::Cluster>_>.
                 super__Head_base<0UL,_amrex::Cluster_*,_false>._M_head_impl);
    this->m_len = (ulong)uVar9;
    minBox(this);
    RVar17 = eff(this);
    if (((RVar15 < RVar17) || (iVar10 == 1)) || (RVar15 < RVar16)) {
      local_c0._M_head_impl =
           (Cluster *)
           newbox._M_t.super___uniq_ptr_impl<amrex::Cluster,_std::default_delete<amrex::Cluster>_>.
           _M_t.super__Tuple_impl<0UL,_amrex::Cluster_*,_std::default_delete<amrex::Cluster>_>.
           super__Head_base<0UL,_amrex::Cluster_*,_false>._M_head_impl;
      newbox._M_t.super___uniq_ptr_impl<amrex::Cluster,_std::default_delete<amrex::Cluster>_>._M_t.
      super__Tuple_impl<0UL,_amrex::Cluster_*,_std::default_delete<amrex::Cluster>_>.
      super__Head_base<0UL,_amrex::Cluster_*,_false>._M_head_impl =
           (__uniq_ptr_data<amrex::Cluster,_std::default_delete<amrex::Cluster>,_true,_true>)
           (__uniq_ptr_impl<amrex::Cluster,_std::default_delete<amrex::Cluster>_>)0x0;
      bVar14 = false;
    }
    else {
      local_a0 = (int)LVar1;
      this->m_len = (long)local_a0;
      minBox(this);
      bVar14 = true;
      local_d4 = uVar11;
    }
    std::unique_ptr<amrex::Cluster,_std::default_delete<amrex::Cluster>_>::~unique_ptr(&newbox);
    iVar10 = iVar10 + 1;
    if (!bVar14) {
LAB_005df979:
      std::array<amrex::Vector<int,_std::allocator<int>_>,_3UL>::~array(&hist);
      return (_Head_base<0UL,_amrex::Cluster_*,_false>)local_c0._M_head_impl;
    }
  }
  local_c0._M_head_impl = chop(this);
  goto LAB_005df979;
}

Assistant:

Cluster*
Cluster::new_chop ()
{
    BL_ASSERT(m_len > 1);
    BL_ASSERT(!(m_ar == 0));

    const int*    lo  = m_bx.loVect();
    const int*    hi  = m_bx.hiVect();
    const IntVect len = m_bx.size();
    //
    // Compute histogram.
    //
    Array<Vector<int>,AMREX_SPACEDIM> hist;
    AMREX_D_TERM(hist[0].resize(len[0], 0);,
                 hist[1].resize(len[1], 0);,
                 hist[2].resize(len[2], 0);)
    for (int n = 0; n < m_len; n++)
    {
        const int* p = m_ar[n].getVect();
        AMREX_D_TERM( hist[0][p[0]-lo[0]]++;,
                      hist[1][p[1]-lo[1]]++;,
                      hist[2][p[2]-lo[2]]++; )
    }

    int invalid_dir = -1;
    for (int n_try = 0; n_try < 2; n_try++)
    {
       //
       // Find cutpoint and cutstatus in each index direction.
       //
       CutStatus mincut = InvalidCut;
       CutStatus status[AMREX_SPACEDIM];
       IntVect cut;
       for (int n = 0; n < AMREX_SPACEDIM; n++)
       {
           if (n != invalid_dir)
           {
              cut[n] = FindCut(hist[n].data(), lo[n], hi[n], status[n]);
              if (status[n] < mincut)
              {
                  mincut = status[n];
              }
           }
       }
       BL_ASSERT(mincut != InvalidCut);
       //
       // Select best cutpoint and direction.
       //
       int dir = -1;
       for (int n = 0, minlen = -1; n < AMREX_SPACEDIM; n++)
       {
           if (status[n] == mincut)
           {
               int mincutlen = std::min(cut[n]-lo[n],hi[n]-cut[n]);
               if (mincutlen >= minlen)
               {
                   dir = n;
                   minlen = mincutlen;
               }
           }
       }
       BL_ASSERT(dir >= 0 && dir < AMREX_SPACEDIM);

       int nlo = 0;
       for (int i = lo[dir]; i < cut[dir]; i++) {
           nlo += hist[dir][i-lo[dir]];
       }

       if (nlo <= 0 || nlo >= m_len) return chop();

       int nhi = m_len - nlo;

       IntVect* prt_it = std::partition(m_ar, m_ar+m_len, Cut(cut,dir));

       BL_ASSERT((prt_it-m_ar) == nlo);
       BL_ASSERT(((m_ar+m_len)-prt_it) == nhi);

       // These refer to the box that was originally passed in
       Real oldeff = eff();
       int orig_mlen = m_len;

       // Define the new box "above" the cut
       std::unique_ptr<Cluster> newbox(new Cluster(prt_it, nhi));
       Real neweff = newbox->eff();

       // Replace the current box by the part of the box "below" the cut
       m_len = nlo;
       minBox();

       if ( (eff() > oldeff) || (neweff > oldeff) || n_try > 0)
       {
          return newbox.release();

       } else {

          // Restore the original box and try again, cutting in a different direction
          m_len = orig_mlen;
          minBox();
          invalid_dir = dir;
       }
   }

    amrex::Abort("Should never reach this point in Cluster::new_chop()");
    return this;
}